

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::updateVirialTensor(SPFForceManager *this)

{
  RealType quantityA;
  RealType quantityB;
  double pressure;
  Mat3x3d pressureTensor;
  Mat3x3d virialTensor;
  Mat3x3d local_1d0;
  Mat3x3d local_188;
  SquareMatrix3<double> local_140;
  Mat3x3d local_f8;
  Mat3x3d local_b0;
  SquareMatrix3<double> local_68;
  
  Snapshot::getVirialTensor(&local_b0,this->temporarySourceSnapshot_);
  Snapshot::getVirialTensor(&local_f8,this->temporarySinkSnapshot_);
  linearCombination<OpenMD::SquareMatrix3<double>>(&local_68,this,&local_b0,&local_f8);
  Snapshot::setVirialTensor(this->currentSnapshot_,&local_68);
  Thermo::getPressureTensor
            (&local_188,
             (this->thermo_)._M_t.
             super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>._M_t.
             super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>.
             super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl,
             this->temporarySourceSnapshot_);
  Thermo::getPressureTensor
            (&local_1d0,
             (this->thermo_)._M_t.
             super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>._M_t.
             super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>.
             super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl,
             this->temporarySinkSnapshot_);
  linearCombination<OpenMD::SquareMatrix3<double>>(&local_140,this,&local_188,&local_1d0);
  Snapshot::setPressureTensor(this->currentSnapshot_,&local_140);
  quantityA = Thermo::getPressure((this->thermo_)._M_t.
                                  super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>
                                  .super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl,
                                  this->temporarySourceSnapshot_);
  quantityB = Thermo::getPressure((this->thermo_)._M_t.
                                  super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>
                                  .super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl,
                                  this->temporarySinkSnapshot_);
  pressure = linearCombination<double>(this,quantityA,quantityB);
  Snapshot::setPressure(this->currentSnapshot_,pressure);
  return;
}

Assistant:

void SPFForceManager::updateVirialTensor() {
    Mat3x3d virialTensor =
        linearCombination(temporarySourceSnapshot_->getVirialTensor(),
                          temporarySinkSnapshot_->getVirialTensor());
    currentSnapshot_->setVirialTensor(virialTensor);

    Mat3x3d pressureTensor =
        linearCombination(thermo_->getPressureTensor(temporarySourceSnapshot_),
                          thermo_->getPressureTensor(temporarySinkSnapshot_));
    currentSnapshot_->setPressureTensor(pressureTensor);

    RealType pressure =
        linearCombination(thermo_->getPressure(temporarySourceSnapshot_),
                          thermo_->getPressure(temporarySinkSnapshot_));
    currentSnapshot_->setPressure(pressure);
  }